

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O0

offset_t __thiscall ser::OffsetTable::GetOffset(OffsetTable *this,int savepointID,string *fieldName)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  SerializationException *pSVar4;
  const_reference this_00;
  pointer ppVar5;
  string local_3e8;
  undefined1 local_3c8 [8];
  SerializationException exception_1;
  ostringstream local_380 [8];
  ostringstream msg_1;
  _Self local_208;
  _Self local_200;
  const_iterator iter;
  OffsetTableEntry *entry;
  undefined1 local_1d0 [8];
  SerializationException exception;
  ostringstream local_198 [8];
  ostringstream msg;
  string *fieldName_local;
  int savepointID_local;
  OffsetTable *this_local;
  
  sVar2 = std::
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
          ::size(&this->entries_);
  if (sVar2 <= (uint)savepointID) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Error: savepoint with ID ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,savepointID);
    poVar3 = std::operator<<(poVar3," is not registered in table\n");
    poVar3 = std::operator<<(poVar3,"Retrieving the offset of the field ");
    poVar3 = std::operator<<(poVar3,(string *)fieldName);
    std::operator<<(poVar3," is not possible\n");
    SerializationException::SerializationException((SerializationException *)local_1d0);
    std::__cxx11::ostringstream::str();
    SerializationException::Init((SerializationException *)local_1d0,(string *)&entry);
    std::__cxx11::string::~string((string *)&entry);
    pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar4,(SerializationException *)local_1d0);
    __cxa_throw(pSVar4,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  iter._M_node = (_Base_ptr)
                 std::
                 vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                 ::operator[](&this->entries_,(long)savepointID);
  local_200._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
               *)iter._M_node,fieldName);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
       ::end(iter._M_node);
  bVar1 = std::operator==(&local_200,&local_208);
  if (!bVar1) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>
             ::operator->(&local_200);
    return (ppVar5->second).offset;
  }
  std::__cxx11::ostringstream::ostringstream(local_380);
  poVar3 = std::operator<<((ostream *)local_380,"Error: field ");
  poVar3 = std::operator<<(poVar3,(string *)fieldName);
  poVar3 = std::operator<<(poVar3," is not registered at the savepoint ");
  this_00 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                      (&this->savepoints_,(long)savepointID);
  Savepoint::ToString_abi_cxx11_((string *)((long)&exception_1.message_.field_2 + 8),this_00);
  poVar3 = std::operator<<(poVar3,(string *)(exception_1.message_.field_2._M_local_buf + 8));
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)(exception_1.message_.field_2._M_local_buf + 8));
  SerializationException::SerializationException((SerializationException *)local_3c8);
  std::__cxx11::ostringstream::str();
  SerializationException::Init((SerializationException *)local_3c8,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  pSVar4 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar4,(SerializationException *)local_3c8);
  __cxa_throw(pSVar4,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

OffsetTable::offset_t OffsetTable::GetOffset(int savepointID, const std::string& fieldName) const
{
    // Check that ID is valid
    if (static_cast<unsigned>(savepointID) >= entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: savepoint with ID " << savepointID << " is not registered in table\n"
            << "Retrieving the offset of the field " << fieldName <<  " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Check that field is saved at savepoint
    const OffsetTableEntry& entry = entries_[savepointID];
    const_iterator iter = entry.find(fieldName);
    if (iter == entry.end())
    {
        std::ostringstream msg;
        msg << "Error: field " << fieldName << " is not registered at the savepoint "
            << savepoints_[savepointID].ToString() << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Return offset
    return iter->second.offset;
}